

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

void __thiscall PFloat::SetValue(PFloat *this,void *addr,double val)

{
  double val_local;
  void *addr_local;
  PFloat *this_local;
  
  if (((ulong)addr & (ulong)((this->super_PBasicType).super_PType.Align - 1)) != 0) {
    __assert_fail("((intptr_t)addr & (Align - 1)) == 0 && \"unaligned address\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobjtype.cpp"
                  ,0x54f,"virtual void PFloat::SetValue(void *, double)");
  }
  if (*(int *)&(this->super_PBasicType).super_PType.super_DObject.field_0x24 == 4) {
    *(float *)addr = (float)val;
  }
  else {
    if (*(int *)&(this->super_PBasicType).super_PType.super_DObject.field_0x24 != 8) {
      __assert_fail("Size == 8",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobjtype.cpp"
                    ,0x556,"virtual void PFloat::SetValue(void *, double)");
    }
    *(double *)addr = val;
  }
  return;
}

Assistant:

void PFloat::SetValue(void *addr, double val)
{
	assert(((intptr_t)addr & (Align - 1)) == 0 && "unaligned address");
	if (Size == 4)
	{
		*(float *)addr = (float)val;
	}
	else
	{
		assert(Size == 8);
		*(double *)addr = val;
	}
}